

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void socket_cb(uv_poll_t *poll,int status,int events)

{
  int iVar1;
  __pid_t child_pid;
  uint uVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  uv_poll_t *unaff_RBX;
  undefined1 *puVar5;
  undefined1 uStack_d1;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  undefined1 auStack_c0 [160];
  uv_poll_t *puStack_20;
  
  socket_cb_called = socket_cb_called + 1;
  if (status == 0) {
    puStack_20 = (uv_poll_t *)0x14ef7b;
    status = events;
    printf("Socket cb got events %d\n");
    unaff_RBX = poll;
    if ((events & 1U) == 0) goto LAB_0014efc7;
    if (socket_cb_read_fd == 0) {
LAB_0014efb2:
      uv_close(poll,0);
      return;
    }
    status = 0x2e0290;
    puStack_20 = (uv_poll_t *)0x14efa2;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_0014efb2;
  }
  else {
    puStack_20 = (uv_poll_t *)0x14efc7;
    socket_cb_cold_1();
LAB_0014efc7:
    puStack_20 = (uv_poll_t *)0x14efcc;
    socket_cb_cold_3();
  }
  puStack_20 = (uv_poll_t *)run_test_fork_socketpair_started;
  socket_cb_cold_2();
  puStack_20 = unaff_RBX;
  iVar1 = pipe(&iStack_c8);
  if (iVar1 == 0) {
    run_timer_loop_once();
    status = 1;
    iVar1 = socketpair(1,1,0,&iStack_d0);
    if (iVar1 != 0) goto LAB_0014f22d;
    uVar4 = uv_default_loop();
    puVar5 = auStack_c0;
    iVar1 = uv_poll_init(uVar4,puVar5,iStack_d0);
    status = (int)puVar5;
    if (iVar1 != 0) goto LAB_0014f232;
    status = 1;
    iVar1 = uv_poll_start(auStack_c0,1,socket_cb);
    if (iVar1 != 0) goto LAB_0014f237;
    uVar4 = uv_default_loop();
    status = 2;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 1) goto LAB_0014f23c;
    child_pid = fork();
    if (child_pid != 0) {
      if (child_pid == -1) goto LAB_0014f246;
      iVar1 = uv_poll_stop(auStack_c0);
      if (iVar1 != 0) goto LAB_0014f24b;
      uv_close(auStack_c0);
      uVar4 = uv_default_loop();
      status = 0;
      iVar1 = uv_run(uVar4);
      if (iVar1 != 0) goto LAB_0014f255;
      if (socket_cb_called != 0) goto LAB_0014f25f;
      status = 0x18323c;
      sVar3 = write(iStack_c4,"1",1);
      if (sVar3 != 1) goto LAB_0014f269;
      status = 0x18271a;
      sVar3 = send(iStack_cc,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_0014f273;
      uVar4 = uv_default_loop();
      status = 0;
      iVar1 = uv_run(uVar4);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_0014f287;
        assert_wait_child(child_pid);
        goto LAB_0014f1e9;
      }
      goto LAB_0014f27d;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    puVar5 = &uStack_d1;
    sVar3 = read(iStack_c8,puVar5,1);
    status = (int)puVar5;
    if (sVar3 != 1) goto LAB_0014f250;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar4);
    if (iVar1 != 0) goto LAB_0014f25a;
    if (socket_cb_called != 0) goto LAB_0014f264;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_d0;
    socket_cb_read_size = 1;
    uVar4 = uv_default_loop();
    status = 0;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 0) goto LAB_0014f26e;
    if (socket_cb_called != 1) goto LAB_0014f278;
    status = 0x2e0290;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014f1e9:
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      status = 0;
      uv_run(uVar4);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014f241;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014f22d:
    run_test_fork_socketpair_started_cold_2();
LAB_0014f232:
    run_test_fork_socketpair_started_cold_3();
LAB_0014f237:
    run_test_fork_socketpair_started_cold_4();
LAB_0014f23c:
    run_test_fork_socketpair_started_cold_5();
LAB_0014f241:
    run_test_fork_socketpair_started_cold_20();
LAB_0014f246:
    run_test_fork_socketpair_started_cold_12();
LAB_0014f24b:
    run_test_fork_socketpair_started_cold_13();
LAB_0014f250:
    run_test_fork_socketpair_started_cold_6();
LAB_0014f255:
    run_test_fork_socketpair_started_cold_14();
LAB_0014f25a:
    run_test_fork_socketpair_started_cold_7();
LAB_0014f25f:
    run_test_fork_socketpair_started_cold_15();
LAB_0014f264:
    run_test_fork_socketpair_started_cold_8();
LAB_0014f269:
    run_test_fork_socketpair_started_cold_16();
LAB_0014f26e:
    run_test_fork_socketpair_started_cold_9();
LAB_0014f273:
    run_test_fork_socketpair_started_cold_17();
LAB_0014f278:
    run_test_fork_socketpair_started_cold_10();
LAB_0014f27d:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014f287:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = status;
  uv_close();
  return;
}

Assistant:

static void socket_cb(uv_poll_t* poll, int status, int events) {
  ssize_t cnt;
  socket_cb_called++;
  ASSERT(0 == status);
  printf("Socket cb got events %d\n", events);
  ASSERT(UV_READABLE == (events & UV_READABLE));
  if (socket_cb_read_fd) {
    cnt = read(socket_cb_read_fd, socket_cb_read_buf, socket_cb_read_size);
    ASSERT(cnt == socket_cb_read_size);
  }
  uv_close((uv_handle_t*) poll, NULL);
}